

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,ReporterConfig *other)

{
  ReporterConfig *other_local;
  ReporterConfig *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)other);
  this->stream = other->stream;
  this->includeSuccessfulResults = (bool)(other->includeSuccessfulResults & 1);
  ConfigData::ConfigData(&this->fullConfig,&other->fullConfig);
  return;
}

Assistant:

ReporterConfig( const ReporterConfig& other )
        :   name( other.name ),
            stream( other.stream ),
            includeSuccessfulResults( other.includeSuccessfulResults ),
            fullConfig( other.fullConfig )
        {}